

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raplcap-msr.c
# Opt level: O3

double raplcap_msr_pd_get_power_units(raplcap *rc,uint32_t pkg,uint32_t die,raplcap_zone zone)

{
  raplcap_msr *ctx;
  int *piVar1;
  double dVar2;
  
  ctx = get_state(rc,pkg,die);
  if (zone < (RAPLCAP_ZONE_PSYS|RAPLCAP_ZONE_CORE)) {
    if ((ctx != (raplcap_msr *)0x0) && (-1 < ZONE_OFFSETS_ENERGY[zone])) {
      dVar2 = msr_get_power_units(&ctx->ctx);
      return dVar2;
    }
  }
  else {
    piVar1 = __errno_location();
    *piVar1 = 0x16;
  }
  return -1.0;
}

Assistant:

double raplcap_msr_pd_get_power_units(const raplcap* rc, uint32_t pkg, uint32_t die, raplcap_zone zone) {
  const raplcap_msr* state = get_state(rc, pkg, die);
  const off_t msr = zone_to_msr_offset(zone, ZONE_OFFSETS_ENERGY);
  raplcap_log(DEBUG, "raplcap_msr_pd_get_power_units: pkg=%"PRIu32", die=%"PRIu32", zone=%d\n", pkg, die, zone);
  if (state == NULL || msr < 0) {
    return -1;
  }
  return msr_get_power_units(&state->ctx);
}